

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O0

void __thiscall FParser::OPgreaterthan(FParser *this,svalue_t *result,int start,int n,int stop)

{
  fsfix fVar1;
  fsfix fVar2;
  int iVar3;
  int iVar4;
  undefined1 local_58 [8];
  svalue_t right;
  svalue_t left;
  int stop_local;
  int n_local;
  int start_local;
  svalue_t *result_local;
  FParser *this_local;
  
  svalue_t::svalue_t((svalue_t *)&right.value);
  svalue_t::svalue_t((svalue_t *)local_58);
  EvaluateExpression(this,(svalue_t *)&right.value,start,n + -1);
  EvaluateExpression(this,(svalue_t *)local_58,n + 1,stop);
  result->type = 1;
  if ((right.value.i == 6) || (local_58._0_4_ == 6)) {
    fVar1 = fixedvalue((svalue_t *)&right.value);
    fVar2 = fixedvalue((svalue_t *)local_58);
    *(uint *)&result->value = (uint)(fVar2 < fVar1);
  }
  else {
    iVar3 = intvalue((svalue_t *)&right.value);
    iVar4 = intvalue((svalue_t *)local_58);
    *(uint *)&result->value = (uint)(iVar4 < iVar3);
  }
  svalue_t::~svalue_t((svalue_t *)local_58);
  svalue_t::~svalue_t((svalue_t *)&right.value);
  return;
}

Assistant:

void FParser::OPgreaterthan(svalue_t &result, int start, int n, int stop)
{
	svalue_t left, right;
	
	evaluate_leftnright(start, n, stop);
	
	// haleyjd: 8-17
	result.type = svt_int;
	if(left.type == svt_fixed || right.type == svt_fixed)
		result.value.i = (fixedvalue(left) > fixedvalue(right));
	else
		result.value.i = (intvalue(left) > intvalue(right));
}